

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-info.cpp
# Opt level: O2

void __thiscall
FileInfoWrapper<ASDCP::DCData::MXFReader,_MyDCDataDescriptor>::~FileInfoWrapper
          (FileInfoWrapper<ASDCP::DCData::MXFReader,_MyDCDataDescriptor> *this)

{
  this->_vptr_FileInfoWrapper = (_func_int **)&PTR__FileInfoWrapper_00110d10;
  ASDCP::WriterInfo::~WriterInfo(&this->m_WriterInfo);
  ASDCP::DCData::MXFReader::~MXFReader(&this->m_Reader);
  return;
}

Assistant:

virtual ~FileInfoWrapper() {}